

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_sync_receive_and_store_pdus(rtr_socket *rtr_socket)

{
  int iVar1;
  pdu_type pVar2;
  pfx_table *pfx_table;
  long in_FS_OFFSET;
  bool bStack_101a9;
  aspa_table *paStack_101a0;
  aspa_table *aspa_shadow_table;
  spki_table *spki_shadow_table;
  pfx_table *pfx_shadow_table;
  pdu_end_of_data_v0 *eod_pdu;
  int __not_first_call;
  void *__cancel_arg;
  _func_void_void_ptr *__cancel_routine;
  int retval;
  pdu_type type;
  rtr_socket *rtr_socket_local;
  recv_loop_cleanup_args cleanup_args;
  pdu_aspa **pppStack_10120;
  int oldcancelstate;
  size_t aspa_pdus_count;
  size_t aspa_pdus_capacity;
  pdu_aspa **aspa_pdus;
  uint router_key_pdus_nindex;
  uint router_key_pdus_size;
  pdu_router_key *router_key_pdus;
  uint ipv4_pdus_nindex;
  uint ipv4_pdus_size;
  pdu_ipv4 *ipv4_pdus;
  uint ipv6_pdus_size;
  uint ipv6_pdus_nindex;
  pdu_ipv6 *ipv6_pdus;
  char pdu_data [65535];
  char txt [52];
  undefined1 local_98 [8];
  __pthread_unwind_buf_t __cancel_buf;
  
  __cancel_buf.__pad[3] = *(void **)(in_FS_OFFSET + 0x28);
  _ipv6_pdus_size = (pdu_ipv6 *)0x0;
  ipv4_pdus._4_4_ = 0;
  ipv4_pdus._0_4_ = 0;
  _ipv4_pdus_nindex = (tr_socket *)0x0;
  router_key_pdus._4_4_ = 0;
  router_key_pdus._0_4_ = 0;
  _router_key_pdus_nindex = (pdu_router_key *)0x0;
  aspa_pdus._4_4_ = 0;
  aspa_pdus._0_4_ = 0;
  aspa_pdus_capacity = 0;
  aspa_pdus_count = 0;
  pppStack_10120 = (pdu_aspa **)0x0;
  rtr_socket_local = (rtr_socket *)&ipv4_pdus_nindex;
  cleanup_args.ipv4_pdus = (pdu_ipv4 **)&ipv6_pdus_size;
  cleanup_args.ipv6_pdus = (pdu_ipv6 **)&router_key_pdus_nindex;
  cleanup_args.router_key_pdus = (pdu_router_key **)&aspa_pdus_capacity;
  cleanup_args.aspa_pdus = &stack0xfffffffffffefee0;
  do {
    iVar1 = __sigsetjmp(local_98,0);
    if (iVar1 != 0) {
      recv_loop_cleanup(&rtr_socket_local);
      if (*(void **)(in_FS_OFFSET + 0x28) != __cancel_buf.__pad[3]) goto LAB_0010ec60;
      __pthread_unwind_next((__pthread_unwind_buf_t *)local_98);
    }
    __pthread_register_cancel((__pthread_unwind_buf_t *)local_98);
    pthread_setcancelstate(0,(int *)((long)&cleanup_args.aspa_pdu_count + 4));
    __cancel_routine._0_4_ = rtr_receive_pdu(rtr_socket,&ipv6_pdus,0xffff,0x3c);
    pthread_setcancelstate(1,(int *)((long)&cleanup_args.aspa_pdu_count + 4));
    __pthread_unregister_cancel((__pthread_unwind_buf_t *)local_98);
    if ((int)__cancel_routine == -2) {
      rtr_change_socket_state(rtr_socket,RTR_ERROR_TRANSPORT);
      __cancel_routine._0_4_ = -1;
      break;
    }
    if ((int)__cancel_routine < 0) {
      __cancel_routine._0_4_ = -1;
      break;
    }
    pVar2 = rtr_get_pdu_type(&ipv6_pdus);
    switch(pVar2) {
    case SERIAL_NOTIFY:
      lrtr_dbg("RTR Socket: Ignoring Serial Notify");
      break;
    default:
      lrtr_dbg("RTR Socket: Received unexpected PDU (Type: %u)",(ulong)ipv6_pdus._1_1_);
      memcpy(pdu_data + 0xfff8,"Unexpected PDU received during data synchronisation",0x34);
      rtr_send_error_pdu_from_host(rtr_socket,&ipv6_pdus,8,CORRUPT_DATA,pdu_data + 0xfff8,0x34);
      __cancel_routine._0_4_ = -1;
      break;
    case IPV4_PREFIX:
      iVar1 = rtr_store_prefix_pdu
                        (rtr_socket,&ipv6_pdus,0x14,(void **)&ipv4_pdus_nindex,
                         (uint *)&router_key_pdus,(uint *)((long)&router_key_pdus + 4));
      if (iVar1 == -1) {
        rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        __cancel_routine._0_4_ = -1;
      }
      break;
    case IPV6_PREFIX:
      iVar1 = rtr_store_prefix_pdu
                        (rtr_socket,&ipv6_pdus,0x20,(void **)&ipv6_pdus_size,
                         (uint *)((long)&ipv4_pdus + 4),(uint *)&ipv4_pdus);
      if (iVar1 == -1) {
        rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        __cancel_routine._0_4_ = -1;
      }
      break;
    case EOD:
      lrtr_dbg("RTR Socket: EOD PDU received.");
      __cancel_routine._0_4_ =
           rtr_handle_eod_pdu(rtr_socket,(pdu_end_of_data_v0 *)&ipv6_pdus,(char *)&ipv6_pdus);
      if ((int)__cancel_routine == 0) {
        if ((rtr_socket->is_resetting & 1U) == 0) {
          __cancel_routine._0_4_ =
               rtr_sync_update_tables
                         (rtr_socket,rtr_socket->pfx_table,rtr_socket->spki_table,
                          rtr_socket->aspa_table,(pdu_ipv4 *)_ipv4_pdus_nindex,(uint)router_key_pdus
                          ,_ipv6_pdus_size,ipv4_pdus._4_4_,_router_key_pdus_nindex,(uint)aspa_pdus,
                          (pdu_aspa **)aspa_pdus_capacity,(size_t)pppStack_10120,
                          (pdu_end_of_data_v0 *)&ipv6_pdus);
        }
        else {
          lrtr_dbg("RTR Socket: Reset in progress creating shadow table for atomic reset");
          pfx_table = (pfx_table *)lrtr_malloc(0x50);
          if (pfx_table == (pfx_table *)0x0) {
            lrtr_dbg("RTR Socket: Memory allocation for pfx shadow table failed");
            __cancel_routine._0_4_ = -1;
          }
          else {
            pfx_table_init(pfx_table,(pfx_update_fp)0x0);
            iVar1 = pfx_table_copy_except_socket(rtr_socket->pfx_table,pfx_table,rtr_socket);
            if (iVar1 == 0) {
              aspa_shadow_table = (aspa_table *)lrtr_malloc(0x170);
              if ((spki_table *)aspa_shadow_table == (spki_table *)0x0) {
                lrtr_dbg("RTR Socket: Memory allocation for spki shadow table failed");
                __cancel_routine._0_4_ = -1;
              }
              else {
                spki_table_init((spki_table *)aspa_shadow_table,(spki_update_fp)0x0);
                iVar1 = spki_table_copy_except_socket
                                  (rtr_socket->spki_table,(spki_table *)aspa_shadow_table,rtr_socket
                                  );
                if (iVar1 == 0) {
                  paStack_101a0 = (aspa_table *)lrtr_malloc(0x80);
                  if (paStack_101a0 == (aspa_table *)0x0) {
                    lrtr_dbg("RTR Socket: Memory allocation for aspa shadow table failed");
                    __cancel_routine._0_4_ = -1;
                  }
                  else {
                    aspa_table_init(paStack_101a0,(aspa_update_fp)0x0);
                    lrtr_dbg("RTR Socket: Shadow tables created");
                    __cancel_routine._0_4_ =
                         rtr_sync_update_tables
                                   (rtr_socket,pfx_table,(spki_table *)aspa_shadow_table,
                                    paStack_101a0,(pdu_ipv4 *)_ipv4_pdus_nindex,
                                    (uint)router_key_pdus,_ipv6_pdus_size,ipv4_pdus._4_4_,
                                    _router_key_pdus_nindex,(uint)aspa_pdus,
                                    (pdu_aspa **)aspa_pdus_capacity,(size_t)pppStack_10120,
                                    (pdu_end_of_data_v0 *)&ipv6_pdus);
                    if ((int)__cancel_routine == 0) {
                      lrtr_dbg("RTR Socket: Reset finished. Swapping new table in.");
                      pfx_table_swap(rtr_socket->pfx_table,pfx_table);
                      spki_table_swap(rtr_socket->spki_table,(spki_table *)aspa_shadow_table);
                      lrtr_dbg("RTR Socket: Replacing ASPA records");
                      aspa_table_src_replace
                                (rtr_socket->aspa_table,paStack_101a0,rtr_socket,
                                 rtr_socket->aspa_table->update_fp != (aspa_update_fp)0x0,false);
                      if (rtr_socket->pfx_table->update_fp == (pfx_update_fp)0x0) {
                        lrtr_dbg("RTR Socket: No pfx update callback. Skipping diff");
                      }
                      else {
                        lrtr_dbg("RTR Socket: Calculating and notifying pfx diff");
                        pfx_table_notify_diff(rtr_socket->pfx_table,pfx_table,rtr_socket);
                      }
                      if (rtr_socket->spki_table->update_fp == (spki_update_fp)0x0) {
                        lrtr_dbg("RTR Socket: No spki update callback. Skipping diff");
                      }
                      else {
                        lrtr_dbg("RTR Socket: Calculating and notifying spki diff");
                        spki_table_notify_diff
                                  (rtr_socket->spki_table,(spki_table *)aspa_shadow_table,rtr_socket
                                  );
                      }
                    }
                  }
                }
                else {
                  lrtr_dbg("RTR Socket: Creation of spki shadow table failed");
                  rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
                  __cancel_routine._0_4_ = -1;
                }
              }
            }
            else {
              lrtr_dbg("RTR Socket: Creation of pfx shadow table failed");
              rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
              __cancel_routine._0_4_ = -1;
            }
          }
          lrtr_dbg("RTR Socket: Freeing shadow tables.");
          if (pfx_table != (pfx_table *)0x0) {
            pfx_table_free_without_notify(pfx_table);
            lrtr_free(pfx_table);
          }
          if (aspa_shadow_table != (aspa_table *)0x0) {
            spki_table_free_without_notify((spki_table *)aspa_shadow_table);
            lrtr_free(aspa_shadow_table);
          }
          if (paStack_101a0 != (aspa_table *)0x0) {
            aspa_table_free(paStack_101a0,false);
            lrtr_free(paStack_101a0);
          }
          rtr_socket->is_resetting = false;
        }
      }
      break;
    case ROUTER_KEY:
      iVar1 = rtr_store_router_key_pdu
                        (rtr_socket,&ipv6_pdus,0x7b,(pdu_router_key **)&router_key_pdus_nindex,
                         (uint *)&aspa_pdus,(uint *)((long)&aspa_pdus + 4));
      if (iVar1 == -1) {
        rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        __cancel_routine._0_4_ = -1;
      }
      break;
    case ERROR:
      rtr_handle_error_pdu(rtr_socket,&ipv6_pdus);
      __cancel_routine._0_4_ = -1;
      break;
    case ASPA:
      iVar1 = rtr_store_aspa_pdu(rtr_socket,(pdu_aspa *)&ipv6_pdus,(pdu_aspa ***)&aspa_pdus_capacity
                                 ,(size_t *)&stack0xfffffffffffefee0,&aspa_pdus_count);
      if (iVar1 == -1) {
        rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        __cancel_routine._0_4_ = -1;
      }
    }
    bStack_101a9 = pVar2 != EOD && (int)__cancel_routine != -1;
  } while (bStack_101a9);
  recv_loop_cleanup(&rtr_socket_local);
  if (*(void **)(in_FS_OFFSET + 0x28) == __cancel_buf.__pad[3]) {
    return (int)__cancel_routine;
  }
LAB_0010ec60:
  __stack_chk_fail();
}

Assistant:

static int rtr_sync_receive_and_store_pdus(struct rtr_socket *rtr_socket)
{
	char pdu_data[RTR_MAX_PDU_LEN];
	enum pdu_type type;
	int retval = RTR_SUCCESS;

	struct pdu_ipv6 *ipv6_pdus = NULL;
	unsigned int ipv6_pdus_nindex = 0; // next free index in ipv6_pdus
	unsigned int ipv6_pdus_size = 0;

	struct pdu_ipv4 *ipv4_pdus = NULL;
	unsigned int ipv4_pdus_size = 0;
	unsigned int ipv4_pdus_nindex = 0; // next free index in ipv4_pdus

	struct pdu_router_key *router_key_pdus = NULL;
	unsigned int router_key_pdus_size = 0;
	unsigned int router_key_pdus_nindex = 0;

	struct pdu_aspa **aspa_pdus = NULL;
	size_t aspa_pdus_capacity = 0;
	size_t aspa_pdus_count = 0;

	int oldcancelstate;
	struct recv_loop_cleanup_args cleanup_args = {.ipv4_pdus = &ipv4_pdus,
						      .ipv6_pdus = &ipv6_pdus,
						      .router_key_pdus = &router_key_pdus,
						      .aspa_pdus = &aspa_pdus,
						      .aspa_pdu_count = &aspa_pdus_count};

	// receive LRTR_IPV4/IPV6/ASPA PDUs till EOD
	do {
		pthread_cleanup_push(recv_loop_cleanup, &cleanup_args);
		pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, &oldcancelstate);

		// Receive PDUs, cancellable
		retval = rtr_receive_pdu(rtr_socket, pdu_data, RTR_MAX_PDU_LEN, RTR_RECV_TIMEOUT);

		pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &oldcancelstate);
		pthread_cleanup_pop(0);

		if (retval == TR_WOULDBLOCK) {
			rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
			retval = RTR_ERROR;
			break;
		} else if (retval < 0) {
			retval = RTR_ERROR;
			break;
		}

		type = rtr_get_pdu_type(pdu_data);

		switch (type) {
		case SERIAL_NOTIFY:
			RTR_DBG1("Ignoring Serial Notify");
			break;

		case IPV4_PREFIX:
			// Temporarily store prefix PDU, handle later after EOD PDU has been received
			if (rtr_store_prefix_pdu(rtr_socket, pdu_data, sizeof(*ipv4_pdus), (void **)&ipv4_pdus,
						 &ipv4_pdus_nindex, &ipv4_pdus_size) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case IPV6_PREFIX:
			// Temporarily store prefix PDU, handle later after EOD PDU has been received
			if (rtr_store_prefix_pdu(rtr_socket, pdu_data, sizeof(*ipv6_pdus), (void **)&ipv6_pdus,
						 &ipv6_pdus_nindex, &ipv6_pdus_size) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case ROUTER_KEY:
			// Temporarily store router key PDU, handle later after EOD PDU has been received
			if (rtr_store_router_key_pdu(rtr_socket, pdu_data, sizeof(*router_key_pdus), &router_key_pdus,
						     &router_key_pdus_nindex, &router_key_pdus_size) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case ASPA:
			// Temporarily store ASPA PDU, handle later after EOD PDU has been received
			if (rtr_store_aspa_pdu(rtr_socket, (struct pdu_aspa *)pdu_data, &aspa_pdus, &aspa_pdus_count,
					       &aspa_pdus_capacity) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case ERROR:
			rtr_handle_error_pdu(rtr_socket, pdu_data);
			retval = RTR_ERROR;
			break;

		case EOD:
			RTR_DBG1("EOD PDU received.");
			struct pdu_end_of_data_v0 *eod_pdu = (struct pdu_end_of_data_v0 *)pdu_data;

			retval = rtr_handle_eod_pdu(rtr_socket, eod_pdu, pdu_data);
			if (retval != RTR_SUCCESS)
				break;

			if (rtr_socket->is_resetting) {
				// Use table copies instead in order to perform an atomic update
				RTR_DBG1("Reset in progress creating shadow table for atomic reset");

				struct pfx_table *pfx_shadow_table = lrtr_malloc(sizeof(struct pfx_table));

				if (!pfx_shadow_table) {
					RTR_DBG1("Memory allocation for pfx shadow table failed");
					retval = RTR_ERROR;
					goto cleanup;
				}
				pfx_table_init(pfx_shadow_table, NULL);
				if (pfx_table_copy_except_socket(rtr_socket->pfx_table, pfx_shadow_table, rtr_socket) !=
				    PFX_SUCCESS) {
					RTR_DBG1("Creation of pfx shadow table failed");
					rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
					retval = RTR_ERROR;
					goto cleanup;
				}

				struct spki_table *spki_shadow_table = lrtr_malloc(sizeof(struct spki_table));

				if (!spki_shadow_table) {
					RTR_DBG1("Memory allocation for spki shadow table failed");
					retval = RTR_ERROR;
					goto cleanup;
				}
				spki_table_init(spki_shadow_table, NULL);
				if (spki_table_copy_except_socket(rtr_socket->spki_table, spki_shadow_table,
								  rtr_socket) != SPKI_SUCCESS) {
					RTR_DBG1("Creation of spki shadow table failed");
					rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
					retval = RTR_ERROR;
					goto cleanup;
				}

				struct aspa_table *aspa_shadow_table = lrtr_malloc(sizeof(struct aspa_table));

				if (!aspa_shadow_table) {
					RTR_DBG1("Memory allocation for aspa shadow table failed");
					retval = RTR_ERROR;
					goto cleanup;
				}
				aspa_table_init(aspa_shadow_table, NULL);

				RTR_DBG1("Shadow tables created");

				retval = rtr_sync_update_tables(rtr_socket, pfx_shadow_table, spki_shadow_table,
								aspa_shadow_table, ipv4_pdus, ipv4_pdus_nindex,
								ipv6_pdus, ipv6_pdus_nindex, router_key_pdus,
								router_key_pdus_nindex, aspa_pdus, aspa_pdus_count,
								eod_pdu);

				if (retval == RTR_SUCCESS) {
					RTR_DBG1("Reset finished. Swapping new table in.");
					pfx_table_swap(rtr_socket->pfx_table, pfx_shadow_table);
					spki_table_swap(rtr_socket->spki_table, spki_shadow_table);

					// No need to notify shadow table's clients as it hasn't any.
					RTR_DBG1("Replacing ASPA records");
					aspa_table_src_replace(rtr_socket->aspa_table, aspa_shadow_table, rtr_socket,
							       !!rtr_socket->aspa_table->update_fp, false);

					if (rtr_socket->pfx_table->update_fp) {
						RTR_DBG1("Calculating and notifying pfx diff");
						pfx_table_notify_diff(rtr_socket->pfx_table, pfx_shadow_table,
								      rtr_socket);
					} else {
						RTR_DBG1("No pfx update callback. Skipping diff");
					}

					if (rtr_socket->spki_table->update_fp) {
						RTR_DBG1("Calculating and notifying spki diff");
						spki_table_notify_diff(rtr_socket->spki_table, spki_shadow_table,
								       rtr_socket);
					} else {
						RTR_DBG1("No spki update callback. Skipping diff");
					}
				}

			cleanup:
				RTR_DBG1("Freeing shadow tables.");
				if (pfx_shadow_table) {
					pfx_table_free_without_notify(pfx_shadow_table);
					lrtr_free(pfx_shadow_table);
				}

				if (spki_shadow_table) {
					spki_table_free_without_notify(spki_shadow_table);
					lrtr_free(spki_shadow_table);
				}

				if (aspa_shadow_table) {
					aspa_table_free(aspa_shadow_table, false);
					lrtr_free(aspa_shadow_table);
				}

				rtr_socket->is_resetting = false;
			} else {
				retval = rtr_sync_update_tables(rtr_socket, rtr_socket->pfx_table,
								rtr_socket->spki_table, rtr_socket->aspa_table,
								ipv4_pdus, ipv4_pdus_nindex, ipv6_pdus,
								ipv6_pdus_nindex, router_key_pdus,
								router_key_pdus_nindex, aspa_pdus, aspa_pdus_count,
								eod_pdu);
			}

			break;

		default:
			RTR_DBG("Received unexpected PDU (Type: %u)", ((struct pdu_header *)pdu_data)->type);
			const char txt[] = "Unexpected PDU received during data synchronisation";

			rtr_send_error_pdu_from_host(rtr_socket, pdu_data, sizeof(struct pdu_header), CORRUPT_DATA, txt,
						     sizeof(txt));
			retval = RTR_ERROR;
			break;
		}
	} while (type != EOD && retval != RTR_ERROR);

	recv_loop_cleanup(&cleanup_args);
	return retval;
}